

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void av1_highbd_inv_txfm_add_8x4_sse4_1
               (tran_low_t *input,uint8_t *dest,int stride,TxfmParam *txfm_param)

{
  int eob;
  TX_SIZE tx_size;
  TX_TYPE tx_type;
  int bd;
  int in_stack_0000011c;
  TX_SIZE in_stack_00000122;
  TX_TYPE in_stack_00000123;
  int in_stack_00000124;
  uint16_t *in_stack_00000128;
  int32_t *in_stack_00000130;
  int in_stack_00000140;
  
  highbd_inv_txfm2d_add_8x4_sse41
            (in_stack_00000130,in_stack_00000128,in_stack_00000124,in_stack_00000123,
             in_stack_00000122,in_stack_0000011c,in_stack_00000140);
  return;
}

Assistant:

static void av1_highbd_inv_txfm_add_8x4_sse4_1(const tran_low_t *input,
                                               uint8_t *dest, int stride,
                                               const TxfmParam *txfm_param) {
  int bd = txfm_param->bd;
  const TX_TYPE tx_type = txfm_param->tx_type;
  const TX_SIZE tx_size = txfm_param->tx_size;
  int eob = txfm_param->eob;
  highbd_inv_txfm2d_add_8x4_sse41(input, CONVERT_TO_SHORTPTR(dest), stride,
                                  tx_type, tx_size, eob, bd);
}